

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

int __thiscall
tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(Float<unsigned_int,_8,_23,_127,_3U> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = this->m_value;
  iVar3 = (uVar1 >> 0x17 & 0xff) - 0x7f;
  iVar2 = -0x7e;
  if ((uVar1 & 0x7fffff) == 0) {
    iVar2 = iVar3;
  }
  if ((uVar1 & 0x7f800000) != 0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}